

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringData.cpp
# Opt level: O3

void __thiscall StringData::printStringDataUtil(StringData *this,StringDataStruct *sdStruct)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  ostream *poVar5;
  uint *puVar6;
  pointer puVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_38,&sdStruct->CountCharacters);
  iVar4 = Utils::lenTwoBytes(&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"      CountCharacters:              ",0x24);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," Unicode characters, ",0x15);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4 * 2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes. ",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"      String:                       ",0x24);
  puVar2 = (sdStruct->String).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (sdStruct->String).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar7 = puVar3 + -1;
  if (puVar2 < puVar7 && puVar2 != puVar3) {
    do {
      puVar6 = puVar2 + 1;
      uVar1 = *puVar2;
      *puVar2 = *puVar7;
      *puVar7 = uVar1;
      puVar7 = puVar7 + -1;
      puVar2 = puVar6;
    } while (puVar6 < puVar7);
  }
  Utils::print_vec_unicode(&sdStruct->String);
  puVar2 = (sdStruct->String).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (sdStruct->String).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar7 = puVar3 + -1;
  if (puVar2 < puVar7 && puVar2 != puVar3) {
    do {
      puVar6 = puVar2 + 1;
      uVar1 = *puVar2;
      *puVar2 = *puVar7;
      *puVar7 = uVar1;
      puVar7 = puVar7 + -1;
      puVar2 = puVar6;
    } while (puVar6 < puVar7);
  }
  return;
}

Assistant:

void StringData::printStringDataUtil(StringDataStruct sdStruct) {
    int len = Utils::lenTwoBytes(sdStruct.CountCharacters);
    cout << "      CountCharacters:              " << dec << len << " Unicode characters, "
         << dec << len * 2 << " bytes. " << endl;
    cout << "      String:                       ";
    reverse(sdStruct.String.begin(), sdStruct.String.end());
    Utils::print_vec_unicode(sdStruct.String);
    reverse(sdStruct.String.begin(), sdStruct.String.end());
}